

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_array_suite.cpp
# Opt level: O1

void api_suite::api_expand_back(void)

{
  long local_68;
  undefined4 local_5c;
  undefined4 local_58 [4];
  undefined4 *local_48;
  long local_40;
  ulong local_38;
  
  local_48 = local_58;
  local_38 = 5;
  local_40 = 1;
  local_58[0] = 0xb;
  local_68 = 1;
  local_5c = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("data.size()","1",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_array_suite.cpp"
             ,0x108,"void api_suite::api_expand_back()",&local_68,&local_5c);
  local_38 = (ulong)((int)local_38 + 1U & 3) | 4;
  local_68 = local_40 + 1;
  if (local_40 == 4) {
    local_68 = 4;
  }
  local_5c = 2;
  local_40 = local_68;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("data.size()","2",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_array_suite.cpp"
             ,0x10a,"void api_suite::api_expand_back()",&local_68,&local_5c);
  return;
}

Assistant:

void api_expand_back()
{
    circular_array<int, 4> data;
    data.push_back(11);
    BOOST_TEST_EQ(data.size(), 1);
    data.expand_back();
    BOOST_TEST_EQ(data.size(), 2);
}